

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar3;
  int iVar4;
  NumericExpr NVar5;
  CountExpr CVar6;
  ExprBase EVar7;
  ExprBase EVar8;
  LogicalExpr LVar9;
  LogicalExpr LVar10;
  LogicalExpr LVar11;
  Impl *pIVar12;
  char *pcVar13;
  TextReader<fmt::Locale> *pTVar14;
  long lVar15;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  BVar16;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  BVar17;
  Impl *local_58;
  undefined8 uStack_50;
  ArgList local_40;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) {
      pNVar2 = this->handler_;
      LVar11 = ReadLogicalExpr(this);
      pBVar3 = pNVar2->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar3->super_ExprFactory).exprs_,&local_58);
      pIVar12 = (Impl *)operator_new__(0x80);
      pIVar12->kind_ = NOT;
      (pBVar3->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar12;
      *(ExprBase *)&pIVar12[2].kind_ = LVar11.super_ExprBase.impl_;
      return (LogicalExpr)pIVar12;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      EVar7.impl_ = (Impl *)ReadLogicalExpr(this);
      EVar8.impl_ = (Impl *)ReadLogicalExpr(this);
LAB_00158103:
      pBVar3 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar3->super_ExprFactory).exprs_,&local_58);
      pIVar12 = (Impl *)operator_new__(0xc0);
      pIVar12->kind_ = kind;
      (pBVar3->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar12;
      *(Impl **)(pIVar12 + 2) = EVar7.impl_;
      *(Impl **)(pIVar12 + 4) = EVar8.impl_;
      return (LogicalExpr)pIVar12;
    }
    if (KVar1 == FIRST_RELATIONAL) {
      pTVar14 = this->reader_;
      pcVar13 = (pTVar14->super_ReaderBase).ptr_;
      (pTVar14->super_ReaderBase).token_ = pcVar13;
      (pTVar14->super_ReaderBase).ptr_ = pcVar13 + 1;
      EVar7.impl_ = (Impl *)ReadNumericExpr(this,*pcVar13,false);
      pTVar14 = this->reader_;
      pcVar13 = (pTVar14->super_ReaderBase).ptr_;
      (pTVar14->super_ReaderBase).token_ = pcVar13;
      (pTVar14->super_ReaderBase).ptr_ = pcVar13 + 1;
      EVar8.impl_ = (Impl *)ReadNumericExpr(this,*pcVar13,false);
      goto LAB_00158103;
    }
switchD_00157e43_caseD_3c:
    local_58 = (Impl *)0x0;
    uStack_50 = 0;
    local_40.types_ = 0;
    local_40.field_1.values_ = (Value *)&local_58;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x1752e9,&local_40
              );
    EVar7.impl_ = (Impl *)0x0;
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pTVar14 = this->reader_;
      pcVar13 = (pTVar14->super_ReaderBase).ptr_;
      (pTVar14->super_ReaderBase).token_ = pcVar13;
      (pTVar14->super_ReaderBase).ptr_ = pcVar13 + 1;
      NVar5 = ReadNumericExpr(this,*pcVar13,false);
      pTVar14 = this->reader_;
      pcVar13 = (pTVar14->super_ReaderBase).ptr_;
      (pTVar14->super_ReaderBase).token_ = pcVar13;
      (pTVar14->super_ReaderBase).ptr_ = pcVar13 + 1;
      if (*pcVar13 == 'o') {
        iVar4 = ReadOpCode(this);
        if (OpCodeInfo::INFO[iVar4].kind != COUNT) {
          pTVar14 = this->reader_;
          pcVar13 = (pTVar14->super_ReaderBase).token_;
          goto LAB_00157e94;
        }
      }
      else {
LAB_00157e94:
        local_58 = (Impl *)0x0;
        uStack_50 = 0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)&local_58;
        TextReader<fmt::Locale>::DoReportError(pTVar14,pcVar13,(CStringRef)0x1752cf,&local_40);
      }
      pNVar2 = this->handler_;
      CVar6 = ReadCountExpr(this);
      pBVar3 = pNVar2->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar3->super_ExprFactory).exprs_,&local_58);
      EVar7.impl_ = (Impl *)operator_new__(0xc0);
      (EVar7.impl_)->kind_ = kind;
      (pBVar3->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar7.impl_;
      *(ExprBase *)&EVar7.impl_[2].kind_ = NVar5.super_ExprBase.impl_;
      *(BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)&EVar7.impl_[4].kind_ =
           CVar6.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
      break;
    default:
      goto switchD_00157e43_caseD_3c;
    case IMPLICATION:
      LVar11 = ReadLogicalExpr(this);
      LVar9 = ReadLogicalExpr(this);
      LVar10 = ReadLogicalExpr(this);
      pBVar3 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar3->super_ExprFactory).exprs_,&local_58);
      EVar7.impl_ = (Impl *)operator_new__(0x100);
      (EVar7.impl_)->kind_ = IMPLICATION;
      (pBVar3->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar7.impl_;
      *(ExprBase *)&EVar7.impl_[2].kind_ = LVar11.super_ExprBase.impl_;
      *(ExprBase *)&EVar7.impl_[4].kind_ = LVar9.super_ExprBase.impl_;
      *(ExprBase *)&EVar7.impl_[6].kind_ = LVar10.super_ExprBase.impl_;
      break;
    case EXISTS:
      iVar4 = ReadNumArgs(this,3);
      BVar16 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar4);
      EVar7.impl_ = &(BVar16.impl_)->super_Impl;
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar4) {
        lVar15 = 0;
        do {
          EVar8.impl_ = (Impl *)ReadLogicalExpr(this);
          ((Impl *)EVar7.impl_)->args[BVar16.arg_index_ + lVar15] = EVar8.impl_;
          lVar15 = lVar15 + 1;
        } while (iVar4 != (int)lVar15);
      }
      break;
    case ALLDIFF:
      iVar4 = ReadNumArgs(this,1);
      BVar17 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar4);
      EVar7.impl_ = &(BVar17.impl_)->super_Impl;
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (0 < iVar4) {
        lVar15 = 0;
        do {
          pTVar14 = this->reader_;
          pcVar13 = (pTVar14->super_ReaderBase).ptr_;
          (pTVar14->super_ReaderBase).token_ = pcVar13;
          (pTVar14->super_ReaderBase).ptr_ = pcVar13 + 1;
          EVar8.impl_ = (Impl *)ReadNumericExpr(this,*pcVar13,false);
          ((Impl *)EVar7.impl_)->args[BVar17.arg_index_ + lVar15] = EVar8.impl_;
          lVar15 = lVar15 + 1;
        } while (iVar4 != (int)lVar15);
      }
    }
  }
  return (LogicalExpr)(ExprBase)EVar7.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}